

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

void __thiscall
flatbuffers::cpp::CppGenerator::GenNativeTable(CppGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppFVar2;
  mapped_type *pmVar3;
  pointer ppFVar4;
  string native_name;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  EscapeKeyword(&local_108,this,(string *)struct_def);
  NativeName(&local_68,&local_108,struct_def,&(this->opts_).super_IDLOptions);
  paVar1 = &local_108.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"STRUCT_NAME","");
  EscapeKeyword(&local_48,this,(string *)struct_def);
  this_00 = &this->code_;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_108);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"NATIVE_NAME","");
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this_00->value_map_,&local_108);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {","");
  CodeWriter::operator+=(this_00,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"  typedef {{STRUCT_NAME}} TableType;","");
  CodeWriter::operator+=(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  GenFullyQualifiedNameGetter(this,struct_def,&local_68);
  ppFVar2 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (struct_def->fields).vec.
                 super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar2;
      ppFVar4 = ppFVar4 + 1) {
    GenMember(this,*ppFVar4);
  }
  GenOperatorNewDelete(this,struct_def);
  GenDefaultConstructor(this,struct_def);
  GenCopyMoveCtorAndAssigOpDecls(this,struct_def);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"};","");
  CodeWriter::operator+=(this_00,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  CodeWriter::operator+=(this_00,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenNativeTable(const StructDef &struct_def) {
    const auto native_name = NativeName(Name(struct_def), &struct_def, opts_);
    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME", native_name);

    // Generate a C++ object that can hold an unpacked version of this table.
    code_ += "struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {";
    code_ += "  typedef {{STRUCT_NAME}} TableType;";
    GenFullyQualifiedNameGetter(struct_def, native_name);
    for (const auto field : struct_def.fields.vec) { GenMember(*field); }
    GenOperatorNewDelete(struct_def);
    GenDefaultConstructor(struct_def);
    GenCopyMoveCtorAndAssigOpDecls(struct_def);
    code_ += "};";
    code_ += "";
  }